

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86_avx2.cpp
# Opt level: O3

void ncnn::conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,Option *opt)

{
  char cVar1;
  char cVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  char cVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  uint uVar13;
  size_t sVar14;
  size_t sVar15;
  undefined1 auVar16 [16];
  int *piVar17;
  int iVar18;
  void *pvVar19;
  ulong uVar20;
  void *pvVar21;
  void *pvVar22;
  void *pvVar23;
  long lVar24;
  void *pvVar25;
  uint *puVar26;
  ulong uVar27;
  void *pvVar28;
  long lVar29;
  long lVar30;
  ulong uVar31;
  undefined4 uVar32;
  void *pvVar33;
  undefined2 *puVar34;
  void *pvVar35;
  void *pvVar36;
  undefined2 *puVar37;
  long lVar38;
  int k_1;
  undefined2 *puVar39;
  ulong uVar40;
  long lVar41;
  long lVar42;
  void *pvVar43;
  void *pvVar44;
  undefined2 *puVar45;
  short tmp [6] [3];
  void *local_120;
  void *local_118;
  ulong local_110;
  void *local_100;
  undefined1 local_a8 [64];
  size_t local_68;
  undefined8 local_60;
  short sStack_58;
  uint auStack_56 [9];
  
  uVar40 = (ulong)(uint)outch;
  local_68 = 0;
  local_a8._0_8_ = (void *)0x0;
  local_a8._8_4_ = 0;
  local_a8._12_4_ = 0;
  local_a8._16_8_ = 0;
  local_a8._24_4_ = 0;
  local_a8._32_8_ = (Allocator *)0x0;
  local_a8._40_4_ = 0;
  local_a8._44_4_ = 0;
  local_a8._48_12_ = SUB1612((undefined1  [16])0x0,4);
  Mat::create((Mat *)local_a8,0x24,inch,outch,2,(Allocator *)0x0);
  if (0 < outch) {
    pvVar44 = kernel->data;
    local_100 = (void *)local_a8._0_8_;
    local_110 = 0;
    do {
      if (0 < inch) {
        iVar18 = inch * 9 * (int)local_110;
        uVar20 = 0;
        pvVar23 = local_100;
        do {
          lVar42 = uVar20 * 9;
          cVar1 = *(char *)((long)pvVar44 + lVar42 + iVar18);
          cVar2 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 1);
          cVar3 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 2);
          cVar4 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 3);
          cVar5 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 4);
          cVar6 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 5);
          cVar7 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 6);
          cVar8 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 7);
          cVar9 = *(char *)((long)pvVar44 + lVar42 + (long)iVar18 + 8);
          lVar42 = 4;
          do {
            sVar10 = *(short *)(&UNK_005199bc + lVar42);
            sVar11 = *(short *)(&UNK_005199be + lVar42);
            sVar12 = *(short *)((long)&DAT_005199c0 + lVar42);
            *(short *)((long)&local_60 + lVar42 + 4) =
                 sVar12 * cVar3 + sVar11 * cVar2 + sVar10 * cVar1;
            *(short *)((long)&local_60 + lVar42 + 6) =
                 sVar12 * cVar6 + sVar11 * cVar5 + sVar10 * cVar4;
            *(short *)((long)auStack_56 + lVar42 + -2) =
                 sVar12 * cVar9 + sVar11 * cVar8 + sVar10 * cVar7;
            lVar42 = lVar42 + 6;
          } while (lVar42 != 0x28);
          lVar42 = 0;
          pvVar19 = pvVar23;
          do {
            sVar10 = *(short *)((long)auStack_56 + lVar42 * 6 + -2);
            uVar13 = *(uint *)((long)auStack_56 + lVar42 * 6);
            puVar26 = &DAT_005199c2;
            lVar29 = 0;
            do {
              auVar16 = vpmullw_avx(ZEXT416(*puVar26),ZEXT416(uVar13));
              uVar32 = vpextrw_avx(auVar16,1);
              *(short *)((long)pvVar19 + lVar29 * 2) =
                   (short)uVar32 + auVar16._0_2_ + *(short *)((long)puVar26 + -2) * sVar10;
              lVar29 = lVar29 + 1;
              puVar26 = (uint *)((long)puVar26 + 6);
            } while (lVar29 != 6);
            lVar42 = lVar42 + 1;
            pvVar19 = (void *)((long)pvVar19 + 0xc);
          } while (lVar42 != 6);
          uVar20 = uVar20 + 1;
          pvVar23 = (void *)((long)pvVar23 + (long)(int)local_a8._44_4_ * local_a8._16_8_);
        } while (uVar20 != (uint)inch);
      }
      local_110 = local_110 + 1;
      local_100 = (void *)((long)local_100 + local_68 * local_a8._16_8_);
    } while (local_110 != uVar40);
  }
  iVar18 = outch + 3;
  if (-1 < outch) {
    iVar18 = outch;
  }
  Mat::create(kernel_tm,inch,0x24,outch + (iVar18 >> 2) * -3,8,4,(Allocator *)0x0);
  uVar20 = 0;
  if (3 < outch) {
    lVar29 = local_68 * local_a8._16_8_;
    iVar18 = kernel_tm->w;
    pvVar23 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    pvVar21 = (void *)(lVar29 * 3 + local_a8._0_8_);
    local_60 = lVar29 * 4;
    lVar42 = (long)(int)local_a8._44_4_ * local_a8._16_8_ * 8;
    pvVar44 = (void *)(local_a8._0_8_ + lVar29 * 2);
    pvVar35 = (void *)(lVar29 + local_a8._0_8_);
    uVar27 = 0;
    pvVar19 = (void *)local_a8._0_8_;
    do {
      lVar29 = 0;
      pvVar33 = pvVar21;
      pvVar43 = pvVar44;
      local_120 = pvVar35;
      local_118 = pvVar19;
      do {
        if (7 < inch) {
          lVar30 = (long)pvVar23 + (long)iVar18 * sVar14 * lVar29 + (uVar27 >> 2) * sVar15 * sVar14;
          pvVar22 = local_118;
          lVar24 = 0;
          pvVar25 = pvVar43;
          pvVar28 = local_120;
          pvVar36 = pvVar33;
          do {
            lVar38 = 0;
            lVar41 = 0;
            do {
              *(undefined2 *)(lVar30 + lVar41) = *(undefined2 *)((long)pvVar22 + lVar38);
              *(undefined2 *)(lVar30 + lVar41 + 2) = *(undefined2 *)((long)pvVar28 + lVar38);
              *(undefined2 *)(lVar30 + lVar41 + 4) = *(undefined2 *)((long)pvVar25 + lVar38);
              *(undefined2 *)(lVar30 + lVar41 + 6) = *(undefined2 *)((long)pvVar36 + lVar38);
              lVar41 = lVar41 + 8;
              lVar38 = lVar38 + (long)(int)local_a8._44_4_ * local_a8._16_8_;
            } while (lVar41 != 0x40);
            lVar38 = lVar24 + 0xf;
            pvVar36 = (void *)((long)pvVar36 + lVar42);
            pvVar25 = (void *)((long)pvVar25 + lVar42);
            pvVar28 = (void *)((long)pvVar28 + lVar42);
            pvVar22 = (void *)((long)pvVar22 + lVar42);
            lVar30 = lVar30 + 0x40;
            lVar24 = lVar24 + 8;
          } while (lVar38 < inch);
        }
        lVar29 = lVar29 + 1;
        pvVar33 = (void *)((long)pvVar33 + 2);
        pvVar43 = (void *)((long)pvVar43 + 2);
        local_120 = (void *)((long)local_120 + 2);
        local_118 = (void *)((long)local_118 + 2);
      } while (lVar29 != 0x24);
      uVar20 = uVar27 + 4;
      uVar31 = uVar27 + 7;
      pvVar21 = (void *)((long)pvVar21 + local_60);
      pvVar44 = (void *)((long)pvVar44 + local_60);
      pvVar35 = (void *)((long)pvVar35 + local_60);
      pvVar19 = (void *)((long)pvVar19 + local_60);
      uVar27 = uVar20;
    } while (uVar31 < uVar40);
  }
  if ((int)uVar20 < outch) {
    iVar18 = kernel_tm->w;
    pvVar44 = kernel_tm->data;
    sVar14 = kernel_tm->elemsize;
    sVar15 = kernel_tm->cstep;
    uVar20 = uVar20 & 0xffffffff;
    puVar34 = (undefined2 *)(local_68 * local_a8._16_8_ * uVar20 + local_a8._0_8_);
    do {
      lVar42 = 0;
      puVar37 = puVar34;
      do {
        if (7 < inch) {
          lVar24 = (long)pvVar44 +
                   (long)iVar18 * sVar14 * lVar42 +
                   (ulong)(((uint)uVar20 & 3) + ((uint)(uVar20 >> 2) & 0x3fffffff)) *
                   sVar15 * sVar14;
          lVar29 = 0;
          puVar45 = puVar37;
          do {
            lVar30 = 0;
            puVar39 = puVar45;
            do {
              *(undefined2 *)(lVar24 + lVar30) = *puVar39;
              puVar39 = (undefined2 *)((long)puVar39 + (long)(int)local_a8._44_4_ * local_a8._16_8_)
              ;
              lVar30 = lVar30 + 2;
            } while (lVar30 != 0x10);
            lVar30 = lVar29 + 0xf;
            puVar45 = puVar45 + (long)(int)local_a8._44_4_ * local_a8._16_8_ * 4;
            lVar24 = lVar24 + 0x10;
            lVar29 = lVar29 + 8;
          } while (lVar30 < inch);
        }
        lVar42 = lVar42 + 1;
        puVar37 = puVar37 + 1;
      } while (lVar42 != 0x24);
      uVar20 = uVar20 + 1;
      puVar34 = (undefined2 *)((long)puVar34 + local_68 * local_a8._16_8_);
    } while (uVar20 != uVar40);
  }
  piVar17 = (int *)CONCAT44(local_a8._12_4_,local_a8._8_4_);
  if (piVar17 != (int *)0x0) {
    LOCK();
    *piVar17 = *piVar17 + -1;
    UNLOCK();
    if (*piVar17 == 0) {
      if ((Allocator *)local_a8._32_8_ == (Allocator *)0x0) {
        if ((void *)local_a8._0_8_ != (void *)0x0) {
          free((void *)local_a8._0_8_);
        }
      }
      else {
        (*(*(_func_int ***)local_a8._32_8_)[3])();
      }
    }
  }
  return;
}

Assistant:

void conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse_avx2(const Mat& kernel, Mat& kernel_tm, int inch, int outch, const Option& opt)
{
    conv3x3s1_winograd43_transform_kernel_pack8to1_int8_sse(kernel, kernel_tm, inch, outch, opt);
}